

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.c
# Opt level: O0

char sdsReqType(size_t string_size)

{
  size_t string_size_local;
  
  if (string_size < 0x20) {
    string_size_local._7_1_ = '\0';
  }
  else if (string_size < 0xff) {
    string_size_local._7_1_ = '\x01';
  }
  else if (string_size < 0xffff) {
    string_size_local._7_1_ = '\x02';
  }
  else if (string_size < 0xffffffff) {
    string_size_local._7_1_ = '\x03';
  }
  else {
    string_size_local._7_1_ = '\x04';
  }
  return string_size_local._7_1_;
}

Assistant:

static inline char sdsReqType(size_t string_size) {
    if (string_size < 32)
        return SDS_TYPE_5;
    if (string_size < 0xff)
        return SDS_TYPE_8;
    if (string_size < 0xffff)
        return SDS_TYPE_16;
    if (string_size < 0xffffffff)
        return SDS_TYPE_32;
    return SDS_TYPE_64;
}